

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>,_738093167U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>,_738093167U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [25];
  uint *local_80;
  uint local_78 [25];
  uint local_14;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_78 + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 100);
  local_80 = local_78;
  Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<-15>,Detail::M3<10>,Detail::M3<-11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<-28>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<_15>,Detail::M3<10>,Detail::M3<_11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<_28>,Detail::NoTempering>
              *)this,&local_80,&local_14);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }